

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerGLSL::constant_expression_vector_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRConstant *c,uint32_t vector)

{
  ConstantVector *pCVar1;
  short sVar2;
  uint32_t uVar3;
  uint uVar4;
  char cVar5;
  uint uVar6;
  SPIRType *pSVar7;
  long *plVar8;
  runtime_error *prVar9;
  undefined **ppuVar10;
  ulong uVar11;
  bool bVar12;
  bool bVar13;
  uint uVar14;
  uint uVar15;
  char cVar16;
  ulong uVar17;
  long lVar18;
  byte bVar19;
  uint uVar20;
  ulong uVar21;
  ushort uVar22;
  SPIRConstant *pSVar23;
  bool bVar24;
  bool bVar25;
  string __str;
  string int64_type;
  SPIRType scalar_type;
  SPIRType type;
  undefined1 local_478 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_468;
  uint *local_458;
  size_t local_450;
  uint local_440 [8];
  bool *local_420;
  size_t local_418;
  bool local_408 [24];
  TypedID<(spirv_cross::Types)1> *local_3f0;
  size_t local_3e8;
  TypedID<(spirv_cross::Types)1> local_3d8 [8];
  uint *local_3b8;
  size_t local_3b0;
  uint local_3a0 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_360;
  ConstantVector *local_328;
  string local_320;
  string local_300;
  SPIRConstant *local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2d8;
  undefined1 local_2d0 [192];
  uint *local_210;
  size_t local_208;
  uint local_1f8 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_1b8;
  undefined1 local_180 [192];
  uint *local_c0;
  size_t local_b8;
  uint local_a8 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  pSVar7 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                      *(uint *)&(c->super_IVariant).field_0xc);
  SPIRType::SPIRType((SPIRType *)local_180,pSVar7);
  local_180._28_4_ = 1;
  SPIRType::SPIRType((SPIRType *)local_2d0,(SPIRType *)local_180);
  local_2d0._24_4_ = 1;
  local_2d8 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_2d8;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar13 = (this->backend).use_constructor_splatting;
  uVar14 = (c->m).c[0].vecsize;
  uVar21 = (ulong)uVar14;
  bVar24 = 1 < uVar21;
  bVar12 = (bool)((this->backend).can_swizzle_scalar & bVar24 & local_180._16_4_ - Half < 3);
  bVar25 = bVar24;
  if (bVar13 == false) {
    bVar25 = bVar12;
  }
  if (bVar25 == true) {
    if (uVar21 != 0) {
      uVar17 = 0;
      do {
        if ((c->m).c[vector].id[uVar17].id != 0) goto LAB_0032b4ea;
        uVar17 = uVar17 + 1;
      } while (uVar21 != uVar17);
    }
    bVar25 = bVar12;
    if (bVar13 != false) {
      bVar25 = 1 < uVar14;
    }
    if (bVar25 == false) {
LAB_0032b4ea:
      bVar19 = 0;
      bVar13 = false;
    }
    else {
      bVar19 = bVar13 & bVar24;
LAB_0032b4b0:
      pCVar1 = (c->m).c + vector;
      if (local_180._20_4_ == 0x40) {
        lVar18 = 0;
        do {
          if (pCVar1->r[0].u64 != (c->m).c[vector].r[lVar18 + 1].u64) goto LAB_0032b4ea;
          lVar18 = lVar18 + 1;
          bVar13 = bVar12;
        } while (uVar21 - 1 != lVar18);
      }
      else {
        lVar18 = 0;
        do {
          if (pCVar1->r[0].u32 != (c->m).c[vector].r[lVar18 + 1].u32) {
            bVar19 = 0;
            bVar12 = false;
          }
          lVar18 = lVar18 + 1;
          bVar13 = bVar12;
        } while (uVar21 - 1 != lVar18);
      }
    }
  }
  else {
    bVar19 = 0;
    bVar13 = false;
    if (bVar12 != false) goto LAB_0032b4b0;
  }
  if ((1 < uVar14) && (bVar13 == false)) {
    (*(this->super_Compiler)._vptr_Compiler[0x13])(&local_300,this,local_180,0);
    plVar8 = (long *)::std::__cxx11::string::append((char *)&local_300);
    ppuVar10 = (undefined **)(plVar8 + 2);
    if ((undefined **)*plVar8 == ppuVar10) {
      local_468._M_allocated_capacity._0_7_ = SUB87(*ppuVar10,0);
      local_468._M_local_buf[7] = (char)((ulong)*ppuVar10 >> 0x38);
      local_468._8_7_ = (undefined7)plVar8[3];
      local_468._M_local_buf[0xf] = (char)((ulong)plVar8[3] >> 0x38);
      local_478._0_8_ = local_478 + 0x10;
    }
    else {
      local_468._M_allocated_capacity._0_7_ = SUB87(*ppuVar10,0);
      local_468._M_local_buf[7] = (char)((ulong)*ppuVar10 >> 0x38);
      local_478._0_8_ = (undefined **)*plVar8;
    }
    local_478._8_8_ = plVar8[1];
    *plVar8 = (long)ppuVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
    if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
      operator_delete((void *)local_478._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
      operator_delete(local_300._M_dataplus._M_p);
    }
  }
  switch(local_180._16_4_) {
  case 2:
    if (bVar19 != 0) {
LAB_0032ce88:
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      goto LAB_0032ce90;
    }
    uVar3 = (c->m).c[0].vecsize;
    if (uVar3 == 0) goto LAB_0032ceb2;
    bVar25 = uVar3 != 1;
    uVar21 = 0;
    do {
      if ((bVar25) && (uVar3 = (c->m).c[vector].id[uVar21].id, uVar3 != 0)) {
        to_expression_abi_cxx11_((string *)local_478,this,uVar3,true);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
        if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
          operator_delete((void *)local_478._0_8_);
        }
      }
      else {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      uVar21 = uVar21 + 1;
      uVar17 = (ulong)(c->m).c[0].vecsize;
      if (uVar21 < uVar17) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        uVar17 = (ulong)(c->m).c[0].vecsize;
      }
      bVar25 = true;
    } while (uVar21 < uVar17);
    break;
  case 3:
    if (bVar19 != 0) {
      cVar16 = *(char *)(c->m).c[vector].r;
      uVar15 = (uint)cVar16;
      uVar14 = -uVar15;
      if (0 < (int)uVar15) {
        uVar14 = uVar15;
      }
      uVar20 = 1;
      if (9 < uVar14) {
        uVar20 = 3 - (uVar14 < 100);
      }
      local_478._0_8_ = local_478 + 0x10;
      ::std::__cxx11::string::_M_construct((ulong)local_478,(char)uVar20 - (cVar16 >> 7));
      ::std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)(local_478._0_8_ + (ulong)(uVar15 >> 0x1f)),uVar20,uVar14);
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
LAB_0032ba22:
      if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) goto LAB_0032ba2b;
      goto LAB_0032ce90;
    }
    uVar3 = (c->m).c[0].vecsize;
    if (uVar3 == 0) goto LAB_0032ceb2;
    bVar25 = uVar3 != 1;
    uVar21 = 0;
    do {
      if ((bVar25) && (uVar3 = (c->m).c[vector].id[uVar21].id, uVar3 != 0)) {
        to_expression_abi_cxx11_((string *)local_478,this,uVar3,true);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
        if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
          operator_delete((void *)local_478._0_8_);
        }
      }
      else {
        (*(this->super_Compiler)._vptr_Compiler[0x13])(local_478,this,local_2d0,0);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
        if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
          operator_delete((void *)local_478._0_8_);
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        cVar16 = *(char *)((c->m).c[vector].r + uVar21);
        uVar15 = (uint)cVar16;
        uVar14 = -uVar15;
        if (0 < (int)uVar15) {
          uVar14 = uVar15;
        }
        uVar20 = 3 - (uVar14 < 100);
        if (uVar14 < 10) {
          uVar20 = 1;
        }
        local_478._0_8_ = local_478 + 0x10;
        ::std::__cxx11::string::_M_construct((ulong)local_478,(char)uVar20 - (cVar16 >> 7));
        ::std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)(local_478._0_8_ + (ulong)(uVar15 >> 0x1f)),uVar20,uVar14);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
        if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
          operator_delete((void *)local_478._0_8_);
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      uVar21 = uVar21 + 1;
      uVar17 = (ulong)(c->m).c[0].vecsize;
      if (uVar21 < uVar17) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        uVar17 = (ulong)(c->m).c[0].vecsize;
      }
      bVar25 = true;
    } while (uVar21 < uVar17);
    break;
  case 4:
    if (bVar19 != 0) {
      uVar14 = (c->m).c[vector].r[0].u32;
      bVar19 = (byte)uVar14;
      uVar15 = 1;
      if (9 < bVar19) {
        uVar15 = 3 - (bVar19 < 100);
      }
      local_478._0_8_ = local_478 + 0x10;
      ::std::__cxx11::string::_M_construct((ulong)local_478,(char)uVar15);
      ::std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)local_478._0_8_,uVar15,uVar14 & 0xff);
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
      goto LAB_0032ba22;
    }
    uVar3 = (c->m).c[0].vecsize;
    if (uVar3 == 0) goto LAB_0032ceb2;
    bVar25 = uVar3 != 1;
    uVar21 = 0;
    do {
      if ((bVar25) && (uVar3 = (c->m).c[vector].id[uVar21].id, uVar3 != 0)) {
        to_expression_abi_cxx11_((string *)local_478,this,uVar3,true);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
        if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
          operator_delete((void *)local_478._0_8_);
        }
      }
      else {
        (*(this->super_Compiler)._vptr_Compiler[0x13])(local_478,this,local_2d0,0);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
        if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
          operator_delete((void *)local_478._0_8_);
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        uVar14 = (c->m).c[vector].r[uVar21].u32;
        bVar19 = (byte)uVar14;
        uVar15 = 3 - (bVar19 < 100);
        if (bVar19 < 10) {
          uVar15 = 1;
        }
        local_478._0_8_ = local_478 + 0x10;
        ::std::__cxx11::string::_M_construct((ulong)local_478,(char)uVar15);
        ::std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)local_478._0_8_,uVar15,uVar14 & 0xff);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
        if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
          operator_delete((void *)local_478._0_8_);
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      uVar21 = uVar21 + 1;
      uVar17 = (ulong)(c->m).c[0].vecsize;
      if (uVar21 < uVar17) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        uVar17 = (ulong)(c->m).c[0].vecsize;
      }
      bVar25 = true;
    } while (uVar21 < uVar17);
    break;
  case 5:
    if (bVar19 != 0) {
      sVar2 = *(short *)(c->m).c[vector].r;
      uVar15 = (uint)sVar2;
      uVar14 = -uVar15;
      if (0 < (int)uVar15) {
        uVar14 = uVar15;
      }
      uVar20 = 1;
      if (((9 < uVar14) && (uVar20 = 2, 99 < uVar14)) && (uVar20 = 3, 999 < uVar14)) {
        uVar20 = 5 - (uVar14 < 10000);
      }
      local_478._0_8_ = local_478 + 0x10;
      ::std::__cxx11::string::_M_construct((ulong)local_478,(char)uVar20 - (char)(sVar2 >> 7));
      ::std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)(local_478._0_8_ + (ulong)(uVar15 >> 0x1f)),uVar20,uVar14);
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
      if ((undefined1 *)local_478._0_8_ == local_478 + 0x10) goto LAB_0032ce90;
LAB_0032ba2b:
      operator_delete((void *)local_478._0_8_);
      goto LAB_0032ce90;
    }
    uVar3 = (c->m).c[0].vecsize;
    if (uVar3 == 0) goto LAB_0032ceb2;
    bVar25 = uVar3 != 1;
    uVar21 = 0;
    do {
      if ((bVar25) && (uVar3 = (c->m).c[vector].id[uVar21].id, uVar3 != 0)) {
        to_expression_abi_cxx11_((string *)local_478,this,uVar3,true);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
        if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
          operator_delete((void *)local_478._0_8_);
        }
      }
      else if (*(this->backend).int16_t_literal_suffix == '\0') {
        (*(this->super_Compiler)._vptr_Compiler[0x13])(local_478,this,local_2d0,0);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
        if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
          operator_delete((void *)local_478._0_8_);
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        sVar2 = *(short *)((c->m).c[vector].r + uVar21);
        uVar15 = (uint)sVar2;
        uVar14 = -uVar15;
        if (0 < (int)uVar15) {
          uVar14 = uVar15;
        }
        uVar20 = 1;
        if (((9 < uVar14) && (uVar20 = 2, 99 < uVar14)) && (uVar20 = 3, 999 < uVar14)) {
          uVar20 = 5 - (uVar14 < 10000);
        }
        local_478._0_8_ = local_478 + 0x10;
        ::std::__cxx11::string::_M_construct((ulong)local_478,(char)uVar20 - (char)(sVar2 >> 7));
        ::std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)(local_478._0_8_ + (ulong)(uVar15 >> 0x1f)),uVar20,uVar14);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
        if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
          operator_delete((void *)local_478._0_8_);
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      else {
        sVar2 = *(short *)((c->m).c[vector].r + uVar21);
        uVar15 = (uint)sVar2;
        uVar14 = -uVar15;
        if (0 < (int)uVar15) {
          uVar14 = uVar15;
        }
        uVar20 = 1;
        if (((9 < uVar14) && (uVar20 = 2, 99 < uVar14)) && (uVar20 = 3, 999 < uVar14)) {
          uVar20 = 5 - (uVar14 < 10000);
        }
        local_478._0_8_ = local_478 + 0x10;
        ::std::__cxx11::string::_M_construct((ulong)local_478,(char)uVar20 - (char)(sVar2 >> 7));
        ::std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)(local_478._0_8_ + (ulong)(uVar15 >> 0x1f)),uVar20,uVar14);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
        if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
          operator_delete((void *)local_478._0_8_);
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      uVar21 = uVar21 + 1;
      uVar17 = (ulong)(c->m).c[0].vecsize;
      if (uVar21 < uVar17) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        uVar17 = (ulong)(c->m).c[0].vecsize;
      }
      bVar25 = true;
    } while (uVar21 < uVar17);
    break;
  case 6:
    if (bVar19 != 0) {
      uVar14 = (c->m).c[vector].r[0].u32;
      cVar16 = '\x01';
      if (9 < uVar14) {
        uVar15 = uVar14;
        cVar5 = '\x04';
        do {
          cVar16 = cVar5;
          if (uVar15 < 100) {
            cVar16 = cVar16 + -2;
            goto LAB_0032cfee;
          }
          if (uVar15 < 1000) {
            cVar16 = cVar16 + -1;
            goto LAB_0032cfee;
          }
          if (uVar15 < 10000) goto LAB_0032cfee;
          bVar25 = 99999 < uVar15;
          uVar15 = uVar15 / 10000;
          cVar5 = cVar16 + '\x04';
        } while (bVar25);
        cVar16 = cVar16 + '\x01';
      }
LAB_0032cfee:
      local_478._0_8_ = local_478 + 0x10;
      ::std::__cxx11::string::_M_construct((ulong)local_478,cVar16);
      ::std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)local_478._0_8_,local_478._8_4_,uVar14);
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
      if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) goto LAB_0032ba2b;
      goto LAB_0032ce90;
    }
    uVar3 = (c->m).c[0].vecsize;
    if (uVar3 == 0) goto LAB_0032ceb2;
    bVar25 = uVar3 != 1;
    uVar21 = 0;
    do {
      if ((bVar25) && (uVar3 = (c->m).c[vector].id[uVar21].id, uVar3 != 0)) {
        to_expression_abi_cxx11_((string *)local_478,this,uVar3,true);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
        if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
          operator_delete((void *)local_478._0_8_);
        }
      }
      else if (*(this->backend).uint16_t_literal_suffix == '\0') {
        (*(this->super_Compiler)._vptr_Compiler[0x13])(local_478,this,local_2d0,0);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
        if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
          operator_delete((void *)local_478._0_8_);
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        uVar14 = (c->m).c[vector].r[uVar21].u32;
        uVar20 = uVar14 & 0xffff;
        uVar15 = 1;
        uVar22 = (ushort)uVar14;
        if (((9 < uVar22) && (uVar15 = 2, 99 < uVar22)) && (uVar15 = 3, 999 < uVar20)) {
          uVar15 = 5 - (uVar20 < 10000);
        }
        local_478._0_8_ = local_478 + 0x10;
        ::std::__cxx11::string::_M_construct((ulong)local_478,(char)uVar15);
        ::std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_478._0_8_,uVar15,uVar20);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
        if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
          operator_delete((void *)local_478._0_8_);
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      else {
        uVar14 = (c->m).c[vector].r[uVar21].u32;
        uVar20 = uVar14 & 0xffff;
        uVar15 = 1;
        uVar22 = (ushort)uVar14;
        if (((9 < uVar22) && (uVar15 = 2, 99 < uVar22)) && (uVar15 = 3, 999 < uVar20)) {
          uVar15 = 5 - (uVar20 < 10000);
        }
        local_478._0_8_ = local_478 + 0x10;
        ::std::__cxx11::string::_M_construct((ulong)local_478,(char)uVar15);
        ::std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_478._0_8_,uVar15,uVar20);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
        if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
          operator_delete((void *)local_478._0_8_);
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      uVar21 = uVar21 + 1;
      uVar17 = (ulong)(c->m).c[0].vecsize;
      if (uVar21 < uVar17) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        uVar17 = (ulong)(c->m).c[0].vecsize;
      }
      bVar25 = true;
    } while (uVar21 < uVar17);
    break;
  case 7:
    if (bVar19 != 0) {
      uVar14 = (c->m).c[vector].r[0].u32;
      if (uVar14 == 0x80000000) {
        local_478._0_8_ = local_478 + 0x10;
        local_468._M_allocated_capacity._0_7_ = 0x38783028746e69;
        local_468._M_local_buf[7] = '0';
        local_468._8_7_ = 0x29303030303030;
        local_478._8_8_ = 0xf;
        local_468._M_local_buf[0xf] = '\0';
      }
      else {
        uVar15 = -uVar14;
        if (0 < (int)uVar14) {
          uVar15 = uVar14;
        }
        uVar20 = 1;
        if (9 < uVar15) {
          uVar21 = (ulong)uVar15;
          uVar4 = 4;
          do {
            uVar20 = uVar4;
            uVar6 = (uint)uVar21;
            if (uVar6 < 100) {
              uVar20 = uVar20 - 2;
              goto LAB_0032d0fa;
            }
            if (uVar6 < 1000) {
              uVar20 = uVar20 - 1;
              goto LAB_0032d0fa;
            }
            if (uVar6 < 10000) goto LAB_0032d0fa;
            uVar21 = uVar21 / 10000;
            uVar4 = uVar20 + 4;
          } while (99999 < uVar6);
          uVar20 = uVar20 + 1;
        }
LAB_0032d0fa:
        local_478._0_8_ = local_478 + 0x10;
        ::std::__cxx11::string::_M_construct
                  ((ulong)local_478,(char)uVar20 - (char)((int)uVar14 >> 0x1f));
        ::std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)(local_478._0_8_ + (ulong)(uVar14 >> 0x1f)),uVar20,uVar15);
      }
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
      if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) goto LAB_0032ba2b;
      goto LAB_0032ce90;
    }
    uVar14 = (c->m).c[0].vecsize;
    uVar17 = (ulong)uVar14;
    if (uVar14 == 0) goto LAB_0032ceb2;
    ppuVar10 = (undefined **)(local_478 + 0x10);
    uVar21 = 0;
    local_328 = (c->m).c + vector;
    pSVar23 = c;
    local_2e0 = c;
    do {
      if (((uint)uVar17 < 2) || (uVar3 = local_328->id[uVar21].id, uVar3 == 0)) {
        uVar14 = (c->m).c[vector].r[uVar21].u32;
        local_478._0_8_ = ppuVar10;
        if (uVar14 == 0x80000000) {
          local_468._8_7_ = 0x29303030303030;
          local_468._M_allocated_capacity._0_7_ = 0x38783028746e69;
          local_468._M_local_buf[7] = '0';
          local_478._8_8_ = 0xf;
          local_468._M_local_buf[0xf] = '\0';
        }
        else {
          uVar15 = -uVar14;
          if (0 < (int)uVar14) {
            uVar15 = uVar14;
          }
          uVar20 = 1;
          if (9 < uVar15) {
            uVar17 = (ulong)uVar15;
            uVar4 = 4;
            do {
              uVar20 = uVar4;
              uVar6 = (uint)uVar17;
              if (uVar6 < 100) {
                uVar20 = uVar20 - 2;
                goto LAB_0032c381;
              }
              if (uVar6 < 1000) {
                uVar20 = uVar20 - 1;
                goto LAB_0032c381;
              }
              if (uVar6 < 10000) goto LAB_0032c381;
              uVar17 = uVar17 / 10000;
              uVar4 = uVar20 + 4;
            } while (99999 < uVar6);
            uVar20 = uVar20 + 1;
          }
LAB_0032c381:
          ::std::__cxx11::string::_M_construct
                    ((ulong)local_478,(char)uVar20 - (char)((int)uVar14 >> 0x1f));
          ::std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)(local_478._0_8_ + (ulong)(uVar14 >> 0x1f)),uVar20,uVar15);
          pSVar23 = local_2e0;
        }
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
      }
      else {
        to_expression_abi_cxx11_((string *)local_478,this,uVar3,true);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
      }
      if ((undefined **)local_478._0_8_ != ppuVar10) {
        operator_delete((void *)local_478._0_8_);
      }
      uVar21 = uVar21 + 1;
      uVar17 = (ulong)(pSVar23->m).c[0].vecsize;
      if (uVar21 < uVar17) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        uVar17 = (ulong)(pSVar23->m).c[0].vecsize;
      }
    } while (uVar21 < uVar17);
    break;
  case 8:
    if (bVar19 != 0) {
      uVar14 = (c->m).c[vector].r[0].u32;
      cVar16 = '\x01';
      if (9 < uVar14) {
        uVar15 = uVar14;
        cVar5 = '\x04';
        do {
          cVar16 = cVar5;
          if (uVar15 < 100) {
            cVar16 = cVar16 + -2;
            goto LAB_0032d03c;
          }
          if (uVar15 < 1000) {
            cVar16 = cVar16 + -1;
            goto LAB_0032d03c;
          }
          if (uVar15 < 10000) goto LAB_0032d03c;
          bVar25 = 99999 < uVar15;
          uVar15 = uVar15 / 10000;
          cVar5 = cVar16 + '\x04';
        } while (bVar25);
        cVar16 = cVar16 + '\x01';
      }
LAB_0032d03c:
      local_478._0_8_ = local_478 + 0x10;
      ::std::__cxx11::string::_M_construct((ulong)local_478,cVar16);
      ::std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)local_478._0_8_,local_478._8_4_,uVar14);
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
      if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
        operator_delete((void *)local_478._0_8_);
      }
      uVar14 = 0x81;
      if ((this->options).es != false) {
        uVar14 = 299;
      }
      if (uVar14 < (this->options).version) {
        if ((this->backend).uint32_t_literal_suffix != false) goto LAB_0032ce88;
      }
      else if ((c->m).c[vector].r[0].i32 < 0) {
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        ::std::runtime_error::runtime_error
                  (prVar9,
                   "Tried to convert uint literal into int, but this made the literal negative.");
        goto LAB_0032d1ad;
      }
      goto LAB_0032ce90;
    }
    uVar14 = (c->m).c[0].vecsize;
    uVar17 = (ulong)uVar14;
    if (uVar14 == 0) goto LAB_0032ceb2;
    uVar21 = 0;
    do {
      if (((uint)uVar17 < 2) || (uVar3 = (c->m).c[vector].id[uVar21].id, uVar3 == 0)) {
        uVar14 = (c->m).c[vector].r[uVar21].u32;
        cVar16 = '\x01';
        if (9 < uVar14) {
          uVar15 = uVar14;
          cVar5 = '\x04';
          do {
            cVar16 = cVar5;
            if (uVar15 < 100) {
              cVar16 = cVar16 + -2;
              goto LAB_0032c8e7;
            }
            if (uVar15 < 1000) {
              cVar16 = cVar16 + -1;
              goto LAB_0032c8e7;
            }
            if (uVar15 < 10000) goto LAB_0032c8e7;
            bVar25 = 99999 < uVar15;
            uVar15 = uVar15 / 10000;
            cVar5 = cVar16 + '\x04';
          } while (bVar25);
          cVar16 = cVar16 + '\x01';
        }
LAB_0032c8e7:
        local_478._0_8_ = local_478 + 0x10;
        ::std::__cxx11::string::_M_construct((ulong)local_478,cVar16);
        ::std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)local_478._0_8_,local_478._8_4_,uVar14);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
        if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
          operator_delete((void *)local_478._0_8_);
        }
        uVar14 = 0x81;
        if ((this->options).es != false) {
          uVar14 = 299;
        }
        if (uVar14 < (this->options).version) {
          if ((this->backend).uint32_t_literal_suffix == true) {
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
        }
        else if ((c->m).c[vector].r[uVar21].i32 < 0) {
          prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
          ::std::runtime_error::runtime_error
                    (prVar9,
                     "Tried to convert uint literal into int, but this made the literal negative.");
          *(undefined ***)prVar9 = &PTR__runtime_error_004faf50;
          __cxa_throw(prVar9,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      else {
        to_expression_abi_cxx11_((string *)local_478,this,uVar3,true);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
        if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
          operator_delete((void *)local_478._0_8_);
        }
      }
      uVar21 = uVar21 + 1;
      uVar17 = (ulong)(c->m).c[0].vecsize;
      if (uVar21 < uVar17) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        uVar17 = (ulong)(c->m).c[0].vecsize;
      }
    } while (uVar21 < uVar17);
    break;
  case 9:
    SPIRType::SPIRType((SPIRType *)local_478,(SPIRType *)local_180);
    local_468._8_7_ = 0x100000001;
    local_468._M_local_buf[0xf] = '\0';
    (*(this->super_Compiler)._vptr_Compiler[0x13])(&local_300,this,local_478,0);
    if (bVar19 == 0) {
      uVar3 = (c->m).c[0].vecsize;
      if (uVar3 != 0) {
        bVar25 = uVar3 != 1;
        uVar21 = 0;
        do {
          if ((bVar25) && (uVar3 = (c->m).c[vector].id[uVar21].id, uVar3 != 0)) {
            to_expression_abi_cxx11_(&local_320,this,uVar3,true);
            ::std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)local_320._M_dataplus._M_p);
          }
          else {
            convert_to_string(&local_320,(c->m).c[vector].r[uVar21].i64,&local_300,
                              (this->backend).long_long_literal_suffix);
            ::std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)local_320._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_320._M_dataplus._M_p != &local_320.field_2) {
            operator_delete(local_320._M_dataplus._M_p);
          }
          uVar21 = uVar21 + 1;
          uVar17 = (ulong)(c->m).c[0].vecsize;
          if (uVar21 < uVar17) {
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
            uVar17 = (ulong)(c->m).c[0].vecsize;
          }
          bVar25 = true;
        } while (uVar21 < uVar17);
      }
    }
    else {
      convert_to_string(&local_320,(c->m).c[vector].r[0].i64,&local_300,
                        (this->backend).long_long_literal_suffix);
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_320._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_dataplus._M_p != &local_320.field_2) {
        operator_delete(local_320._M_dataplus._M_p);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
      operator_delete(local_300._M_dataplus._M_p);
    }
    local_478._0_8_ = &PTR__SPIRType_004faf78;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_360);
    local_3b0 = 0;
    if (local_3b8 != local_3a0) {
      free(local_3b8);
    }
    local_3e8 = 0;
    if (local_3f0 != local_3d8) {
      free(local_3f0);
    }
    local_418 = 0;
    if (local_420 != local_408) {
      free(local_420);
    }
    local_450 = 0;
    if (local_458 != local_440) {
      free(local_458);
    }
LAB_0032ce90:
    uVar17 = (ulong)(c->m).c[0].vecsize;
    break;
  case 10:
    if (bVar19 != 0) {
      uVar21 = (c->m).c[vector].r[0].u64;
      cVar16 = '\x01';
      if (9 < uVar21) {
        uVar17 = uVar21;
        cVar5 = '\x04';
        do {
          cVar16 = cVar5;
          if (uVar17 < 100) {
            cVar16 = cVar16 + -2;
            goto LAB_0032ce21;
          }
          if (uVar17 < 1000) {
            cVar16 = cVar16 + -1;
            goto LAB_0032ce21;
          }
          if (uVar17 < 10000) goto LAB_0032ce21;
          bVar25 = 99999 < uVar17;
          uVar17 = uVar17 / 10000;
          cVar5 = cVar16 + '\x04';
        } while (bVar25);
        cVar16 = cVar16 + '\x01';
      }
LAB_0032ce21:
      local_478._0_8_ = local_478 + 0x10;
      ::std::__cxx11::string::_M_construct((ulong)local_478,cVar16);
      ::std::__detail::__to_chars_10_impl<unsigned_long>
                ((char *)local_478._0_8_,local_478._8_4_,uVar21);
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
      if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
        operator_delete((void *)local_478._0_8_);
      }
      goto LAB_0032ce88;
    }
    uVar14 = (c->m).c[0].vecsize;
    uVar17 = (ulong)uVar14;
    if (uVar14 == 0) goto LAB_0032ceb2;
    ppuVar10 = (undefined **)(local_478 + 0x10);
    uVar21 = 0;
    local_328 = (c->m).c + vector;
    do {
      if (((uint)uVar17 < 2) || (uVar3 = local_328->id[uVar21].id, uVar3 == 0)) {
        uVar17 = (c->m).c[vector].r[uVar21].u64;
        cVar16 = '\x01';
        if (9 < uVar17) {
          uVar11 = uVar17;
          cVar5 = '\x04';
          do {
            cVar16 = cVar5;
            if (uVar11 < 100) {
              cVar16 = cVar16 + -2;
              goto LAB_0032bce3;
            }
            if (uVar11 < 1000) {
              cVar16 = cVar16 + -1;
              goto LAB_0032bce3;
            }
            if (uVar11 < 10000) goto LAB_0032bce3;
            bVar25 = 99999 < uVar11;
            uVar11 = uVar11 / 10000;
            cVar5 = cVar16 + '\x04';
          } while (bVar25);
          cVar16 = cVar16 + '\x01';
        }
LAB_0032bce3:
        local_478._0_8_ = ppuVar10;
        ::std::__cxx11::string::_M_construct((ulong)local_478,cVar16);
        ::std::__detail::__to_chars_10_impl<unsigned_long>
                  ((char *)local_478._0_8_,local_478._8_4_,uVar17);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
        if ((undefined **)local_478._0_8_ != ppuVar10) {
          operator_delete((void *)local_478._0_8_);
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      else {
        to_expression_abi_cxx11_((string *)local_478,this,uVar3,true);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
        if ((undefined **)local_478._0_8_ != ppuVar10) {
          operator_delete((void *)local_478._0_8_);
        }
      }
      uVar21 = uVar21 + 1;
      uVar17 = (ulong)(c->m).c[0].vecsize;
      if (uVar21 < uVar17) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        uVar17 = (ulong)(c->m).c[0].vecsize;
      }
    } while (uVar21 < uVar17);
    break;
  default:
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(prVar9,"Invalid constant expression basetype.");
LAB_0032d1ad:
    *(undefined ***)prVar9 = &PTR__runtime_error_004faf50;
    __cxa_throw(prVar9,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  case 0xc:
    if ((bVar19 != 0) || (bVar13 != false)) {
      convert_half_to_string_abi_cxx11_((string *)local_478,this,c,vector,0);
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
      if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
        operator_delete((void *)local_478._0_8_);
      }
      if (bVar13 != false) {
        pSVar7 = Variant::get<spirv_cross::SPIRType>
                           ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr
                            + *(uint *)&(c->super_IVariant).field_0xc);
        remap_swizzle((string *)local_478,this,pSVar7,1,__return_storage_ptr__);
LAB_0032b7cd:
        ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_478);
        goto LAB_0032ba22;
      }
      goto LAB_0032ce90;
    }
    uVar3 = (c->m).c[0].vecsize;
    if (uVar3 == 0) goto LAB_0032ceb2;
    bVar25 = uVar3 != 1;
    uVar21 = 0;
    do {
      if ((bVar25) && (uVar3 = (c->m).c[vector].id[uVar21].id, uVar3 != 0)) {
        to_expression_abi_cxx11_((string *)local_478,this,uVar3,true);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
      }
      else {
        convert_half_to_string_abi_cxx11_((string *)local_478,this,c,vector,(uint32_t)uVar21);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
      }
      if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
        operator_delete((void *)local_478._0_8_);
      }
      uVar21 = uVar21 + 1;
      uVar17 = (ulong)(c->m).c[0].vecsize;
      if (uVar21 < uVar17) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        uVar17 = (ulong)(c->m).c[0].vecsize;
      }
      bVar25 = true;
    } while (uVar21 < uVar17);
    break;
  case 0xd:
    if ((bVar19 != 0) || (bVar13 != false)) {
      convert_float_to_string_abi_cxx11_((string *)local_478,this,c,vector,0);
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
      if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
        operator_delete((void *)local_478._0_8_);
      }
      if (bVar13 != false) {
        pSVar7 = Variant::get<spirv_cross::SPIRType>
                           ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr
                            + *(uint *)&(c->super_IVariant).field_0xc);
        remap_swizzle((string *)local_478,this,pSVar7,1,__return_storage_ptr__);
        goto LAB_0032b7cd;
      }
      goto LAB_0032ce90;
    }
    uVar3 = (c->m).c[0].vecsize;
    if (uVar3 == 0) goto LAB_0032ceb2;
    bVar25 = uVar3 != 1;
    uVar21 = 0;
    do {
      if ((bVar25) && (uVar3 = (c->m).c[vector].id[uVar21].id, uVar3 != 0)) {
        to_expression_abi_cxx11_((string *)local_478,this,uVar3,true);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
      }
      else {
        convert_float_to_string_abi_cxx11_((string *)local_478,this,c,vector,(uint32_t)uVar21);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
      }
      if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
        operator_delete((void *)local_478._0_8_);
      }
      uVar21 = uVar21 + 1;
      uVar17 = (ulong)(c->m).c[0].vecsize;
      if (uVar21 < uVar17) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        uVar17 = (ulong)(c->m).c[0].vecsize;
      }
      bVar25 = true;
    } while (uVar21 < uVar17);
    break;
  case 0xe:
    if ((bVar19 != 0) || (bVar13 != false)) {
      convert_double_to_string_abi_cxx11_((string *)local_478,this,c,vector,0);
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
      if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
        operator_delete((void *)local_478._0_8_);
      }
      if (bVar13 != false) {
        pSVar7 = Variant::get<spirv_cross::SPIRType>
                           ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr
                            + *(uint *)&(c->super_IVariant).field_0xc);
        remap_swizzle((string *)local_478,this,pSVar7,1,__return_storage_ptr__);
        goto LAB_0032b7cd;
      }
      goto LAB_0032ce90;
    }
    uVar3 = (c->m).c[0].vecsize;
    if (uVar3 == 0) goto LAB_0032ceb2;
    bVar25 = uVar3 != 1;
    uVar21 = 0;
    do {
      if ((bVar25) && (uVar3 = (c->m).c[vector].id[uVar21].id, uVar3 != 0)) {
        to_expression_abi_cxx11_((string *)local_478,this,uVar3,true);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
      }
      else {
        convert_double_to_string_abi_cxx11_((string *)local_478,this,c,vector,(uint32_t)uVar21);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
      }
      if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
        operator_delete((void *)local_478._0_8_);
      }
      uVar21 = uVar21 + 1;
      uVar17 = (ulong)(c->m).c[0].vecsize;
      if (uVar21 < uVar17) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        uVar17 = (ulong)(c->m).c[0].vecsize;
      }
      bVar25 = true;
    } while (uVar21 < uVar17);
  }
  if ((1 < (uint)uVar17) && (bVar13 == false)) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
LAB_0032ceb2:
  local_2d0._0_8_ = &PTR__SPIRType_004faf78;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_1b8);
  local_208 = 0;
  if (local_210 != local_1f8) {
    free(local_210);
  }
  local_2d0._144_8_ = 0;
  if ((TypedID<(spirv_cross::Types)1> *)local_2d0._136_8_ !=
      (TypedID<(spirv_cross::Types)1> *)(local_2d0 + 0xa0)) {
    free((void *)local_2d0._136_8_);
  }
  local_2d0._96_8_ = 0;
  if ((undefined1 *)local_2d0._88_8_ != local_2d0 + 0x70) {
    free((void *)local_2d0._88_8_);
  }
  local_2d0._40_8_ = 0;
  if ((undefined1 *)local_2d0._32_8_ != local_2d0 + 0x38) {
    free((void *)local_2d0._32_8_);
  }
  local_180._0_8_ = &PTR__SPIRType_004faf78;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_68);
  local_b8 = 0;
  if (local_c0 != local_a8) {
    free(local_c0);
  }
  local_180._144_8_ = 0;
  if ((TypedID<(spirv_cross::Types)1> *)local_180._136_8_ !=
      (TypedID<(spirv_cross::Types)1> *)(local_180 + 0xa0)) {
    free((void *)local_180._136_8_);
  }
  local_180._96_8_ = 0;
  if ((undefined1 *)local_180._88_8_ != local_180 + 0x70) {
    free((void *)local_180._88_8_);
  }
  local_180._40_8_ = 0;
  if ((undefined1 *)local_180._32_8_ != local_180 + 0x38) {
    free((void *)local_180._32_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::constant_expression_vector(const SPIRConstant &c, uint32_t vector)
{
	auto type = get<SPIRType>(c.constant_type);
	type.columns = 1;

	auto scalar_type = type;
	scalar_type.vecsize = 1;

	string res;
	bool splat = backend.use_constructor_splatting && c.vector_size() > 1;
	bool swizzle_splat = backend.can_swizzle_scalar && c.vector_size() > 1;

	if (!type_is_floating_point(type))
	{
		// Cannot swizzle literal integers as a special case.
		swizzle_splat = false;
	}

	if (splat || swizzle_splat)
	{
		// Cannot use constant splatting if we have specialization constants somewhere in the vector.
		for (uint32_t i = 0; i < c.vector_size(); i++)
		{
			if (c.specialization_constant_id(vector, i) != 0)
			{
				splat = false;
				swizzle_splat = false;
				break;
			}
		}
	}

	if (splat || swizzle_splat)
	{
		if (type.width == 64)
		{
			uint64_t ident = c.scalar_u64(vector, 0);
			for (uint32_t i = 1; i < c.vector_size(); i++)
			{
				if (ident != c.scalar_u64(vector, i))
				{
					splat = false;
					swizzle_splat = false;
					break;
				}
			}
		}
		else
		{
			uint32_t ident = c.scalar(vector, 0);
			for (uint32_t i = 1; i < c.vector_size(); i++)
			{
				if (ident != c.scalar(vector, i))
				{
					splat = false;
					swizzle_splat = false;
				}
			}
		}
	}

	if (c.vector_size() > 1 && !swizzle_splat)
		res += type_to_glsl(type) + "(";

	switch (type.basetype)
	{
	case SPIRType::Half:
		if (splat || swizzle_splat)
		{
			res += convert_half_to_string(c, vector, 0);
			if (swizzle_splat)
				res = remap_swizzle(get<SPIRType>(c.constant_type), 1, res);
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
					res += convert_half_to_string(c, vector, i);

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::Float:
		if (splat || swizzle_splat)
		{
			res += convert_float_to_string(c, vector, 0);
			if (swizzle_splat)
				res = remap_swizzle(get<SPIRType>(c.constant_type), 1, res);
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
					res += convert_float_to_string(c, vector, i);

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::Double:
		if (splat || swizzle_splat)
		{
			res += convert_double_to_string(c, vector, 0);
			if (swizzle_splat)
				res = remap_swizzle(get<SPIRType>(c.constant_type), 1, res);
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
					res += convert_double_to_string(c, vector, i);

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::Int64:
	{
		auto tmp = type;
		tmp.vecsize = 1;
		tmp.columns = 1;
		auto int64_type = type_to_glsl(tmp);

		if (splat)
		{
			res += convert_to_string(c.scalar_i64(vector, 0), int64_type, backend.long_long_literal_suffix);
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
					res += convert_to_string(c.scalar_i64(vector, i), int64_type, backend.long_long_literal_suffix);

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;
	}

	case SPIRType::UInt64:
		if (splat)
		{
			res += convert_to_string(c.scalar_u64(vector, 0));
			if (backend.long_long_literal_suffix)
				res += "ull";
			else
				res += "ul";
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
				{
					res += convert_to_string(c.scalar_u64(vector, i));
					if (backend.long_long_literal_suffix)
						res += "ull";
					else
						res += "ul";
				}

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::UInt:
		if (splat)
		{
			res += convert_to_string(c.scalar(vector, 0));
			if (is_legacy())
			{
				// Fake unsigned constant literals with signed ones if possible.
				// Things like array sizes, etc, tend to be unsigned even though they could just as easily be signed.
				if (c.scalar_i32(vector, 0) < 0)
					SPIRV_CROSS_THROW("Tried to convert uint literal into int, but this made the literal negative.");
			}
			else if (backend.uint32_t_literal_suffix)
				res += "u";
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
				{
					res += convert_to_string(c.scalar(vector, i));
					if (is_legacy())
					{
						// Fake unsigned constant literals with signed ones if possible.
						// Things like array sizes, etc, tend to be unsigned even though they could just as easily be signed.
						if (c.scalar_i32(vector, i) < 0)
							SPIRV_CROSS_THROW("Tried to convert uint literal into int, but this made "
							                  "the literal negative.");
					}
					else if (backend.uint32_t_literal_suffix)
						res += "u";
				}

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::Int:
		if (splat)
			res += convert_to_string(c.scalar_i32(vector, 0));
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
					res += convert_to_string(c.scalar_i32(vector, i));
				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::UShort:
		if (splat)
		{
			res += convert_to_string(c.scalar(vector, 0));
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
				{
					if (*backend.uint16_t_literal_suffix)
					{
						res += convert_to_string(c.scalar_u16(vector, i));
						res += backend.uint16_t_literal_suffix;
					}
					else
					{
						// If backend doesn't have a literal suffix, we need to value cast.
						res += type_to_glsl(scalar_type);
						res += "(";
						res += convert_to_string(c.scalar_u16(vector, i));
						res += ")";
					}
				}

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::Short:
		if (splat)
		{
			res += convert_to_string(c.scalar_i16(vector, 0));
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
				{
					if (*backend.int16_t_literal_suffix)
					{
						res += convert_to_string(c.scalar_i16(vector, i));
						res += backend.int16_t_literal_suffix;
					}
					else
					{
						// If backend doesn't have a literal suffix, we need to value cast.
						res += type_to_glsl(scalar_type);
						res += "(";
						res += convert_to_string(c.scalar_i16(vector, i));
						res += ")";
					}
				}

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::UByte:
		if (splat)
		{
			res += convert_to_string(c.scalar_u8(vector, 0));
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
				{
					res += type_to_glsl(scalar_type);
					res += "(";
					res += convert_to_string(c.scalar_u8(vector, i));
					res += ")";
				}

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::SByte:
		if (splat)
		{
			res += convert_to_string(c.scalar_i8(vector, 0));
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
				{
					res += type_to_glsl(scalar_type);
					res += "(";
					res += convert_to_string(c.scalar_i8(vector, i));
					res += ")";
				}

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::Boolean:
		if (splat)
			res += c.scalar(vector, 0) ? "true" : "false";
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
					res += c.scalar(vector, i) ? "true" : "false";

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	default:
		SPIRV_CROSS_THROW("Invalid constant expression basetype.");
	}

	if (c.vector_size() > 1 && !swizzle_splat)
		res += ")";

	return res;
}